

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecfactory.cpp
# Opt level: O3

void __thiscall FastPForLib::CODECFactory::CODECFactory(CODECFactory *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_type __dnew;
  _Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false> local_50;
  key_type local_48;
  _Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false> local_28;
  
  p_Var1 = &(this->scodecmap)._M_t._M_impl.super__Rb_tree_header;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->scodecmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28._M_head_impl = (IntegerCODEC *)operator_new(0x18);
  paVar2 = &local_48.field_2;
  (local_28._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2460;
  local_28._M_head_impl[1]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c24d0;
  local_28._M_head_impl[2]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2540;
  local_50._M_head_impl = (IntegerCODEC *)0x12;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  local_48._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
  local_48.field_2._M_allocated_capacity._0_4_ = SUB84(local_50._M_head_impl,0);
  local_48.field_2._M_local_buf[4] = (char)((ulong)local_50._M_head_impl >> 0x20);
  local_48.field_2._M_local_buf[5] = (char)((ulong)local_50._M_head_impl >> 0x28);
  local_48.field_2._M_local_buf[6] = (char)((ulong)local_50._M_head_impl >> 0x30);
  local_48.field_2._M_local_buf[7] = (char)((ulong)local_50._M_head_impl >> 0x38);
  builtin_strncpy(local_48._M_dataplus._M_p,"fastbinarypacking8",0x12);
  local_48._M_string_length = (size_type)local_50._M_head_impl;
  local_48._M_dataplus._M_p[(long)local_50._M_head_impl] = '\0';
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_28._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_28._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_28._M_head_impl = (IntegerCODEC *)operator_new(0x18);
  (local_28._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c25b0;
  local_28._M_head_impl[1]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2620;
  local_28._M_head_impl[2]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2540;
  local_50._M_head_impl = (IntegerCODEC *)0x13;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  local_48._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
  local_48.field_2._M_allocated_capacity._0_4_ = SUB84(local_50._M_head_impl,0);
  local_48.field_2._M_local_buf[4] = (char)((ulong)local_50._M_head_impl >> 0x20);
  local_48.field_2._M_local_buf[5] = (char)((ulong)local_50._M_head_impl >> 0x28);
  local_48.field_2._M_local_buf[6] = (char)((ulong)local_50._M_head_impl >> 0x30);
  local_48.field_2._M_local_buf[7] = (char)((ulong)local_50._M_head_impl >> 0x38);
  builtin_strncpy(local_48._M_dataplus._M_p,"fastbinarypacking16",0x13);
  local_48._M_string_length = (size_type)local_50._M_head_impl;
  local_48._M_dataplus._M_p[(long)local_50._M_head_impl] = '\0';
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_28._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_28._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_28._M_head_impl = (IntegerCODEC *)operator_new(0x18);
  (local_28._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2690;
  local_28._M_head_impl[1]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2700;
  local_28._M_head_impl[2]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2540;
  local_50._M_head_impl = (IntegerCODEC *)0x13;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  local_48._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
  local_48.field_2._M_allocated_capacity._0_4_ = SUB84(local_50._M_head_impl,0);
  local_48.field_2._M_local_buf[4] = (char)((ulong)local_50._M_head_impl >> 0x20);
  local_48.field_2._M_local_buf[5] = (char)((ulong)local_50._M_head_impl >> 0x28);
  local_48.field_2._M_local_buf[6] = (char)((ulong)local_50._M_head_impl >> 0x30);
  local_48.field_2._M_local_buf[7] = (char)((ulong)local_50._M_head_impl >> 0x38);
  builtin_strncpy(local_48._M_dataplus._M_p,"fastbinarypacking32",0x13);
  local_48._M_string_length = (size_type)local_50._M_head_impl;
  local_48._M_dataplus._M_p[(long)local_50._M_head_impl] = '\0';
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_28._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_28._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(0x18);
  local_48.field_2._M_allocated_capacity._0_4_ = 0x32335042;
  local_48._M_string_length = 4;
  local_48.field_2._M_local_buf[4] = '\0';
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2770;
  local_50._M_head_impl[1]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c27e0;
  local_50._M_head_impl[2]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2540;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  vsencoding_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x6e657376;
  local_48.field_2._M_local_buf[4] = 'c';
  local_48.field_2._M_local_buf[5] = 'o';
  local_48.field_2._M_local_buf[6] = 'd';
  local_48.field_2._M_local_buf[7] = 'i';
  local_48.field_2._M_local_buf[8] = 'n';
  local_48.field_2._M_local_buf[9] = 'g';
  local_48._M_string_length = 10;
  local_48.field_2._M_local_buf[10] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  fastpfor128_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x74736166;
  local_48.field_2._M_local_buf[4] = 'p';
  local_48.field_2._M_local_buf[5] = 'f';
  local_48.field_2._M_local_buf[6] = 'o';
  local_48.field_2._M_local_buf[7] = 'r';
  local_48.field_2._M_local_buf[8] = '1';
  local_48.field_2._M_local_buf[9] = '2';
  local_48.field_2._M_local_buf[10] = '8';
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  fastpfor256_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x74736166;
  local_48.field_2._M_local_buf[4] = 'p';
  local_48.field_2._M_local_buf[5] = 'f';
  local_48.field_2._M_local_buf[6] = 'o';
  local_48.field_2._M_local_buf[7] = 'r';
  local_48.field_2._M_local_buf[8] = '2';
  local_48.field_2._M_local_buf[9] = '5';
  local_48.field_2._M_local_buf[10] = '6';
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdfastpfor128_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x646d6973;
  local_48.field_2._M_local_buf[4] = 'f';
  local_48.field_2._M_local_buf[5] = 'a';
  local_48.field_2._M_local_buf[6] = 's';
  local_48.field_2._M_local_buf[7] = 't';
  local_48.field_2._M_local_buf[8] = 'p';
  local_48.field_2._M_local_buf[9] = 'f';
  local_48.field_2._M_local_buf[10] = 'o';
  local_48.field_2._M_local_buf[0xb] = 'r';
  local_48.field_2._M_local_buf[0xc] = '1';
  local_48.field_2._M_local_buf[0xd] = '2';
  local_48.field_2._M_local_buf[0xe] = '8';
  local_48._M_string_length = 0xf;
  local_48.field_2._M_local_buf[0xf] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdfastpfor256_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x646d6973;
  local_48.field_2._M_local_buf[4] = 'f';
  local_48.field_2._M_local_buf[5] = 'a';
  local_48.field_2._M_local_buf[6] = 's';
  local_48.field_2._M_local_buf[7] = 't';
  local_48.field_2._M_local_buf[8] = 'p';
  local_48.field_2._M_local_buf[9] = 'f';
  local_48.field_2._M_local_buf[10] = 'o';
  local_48.field_2._M_local_buf[0xb] = 'r';
  local_48.field_2._M_local_buf[0xc] = '2';
  local_48.field_2._M_local_buf[0xd] = '5';
  local_48.field_2._M_local_buf[0xe] = '6';
  local_48._M_string_length = 0xf;
  local_48.field_2._M_local_buf[0xf] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simplepfor_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x706d6973;
  local_48.field_2._M_local_buf[4] = 'l';
  local_48.field_2._M_local_buf[5] = 'e';
  local_48.field_2._M_local_buf[6] = 'p';
  local_48.field_2._M_local_buf[7] = 'f';
  local_48.field_2._M_local_buf[8] = 'o';
  local_48.field_2._M_local_buf[9] = 'r';
  local_48._M_string_length = 10;
  local_48.field_2._M_local_buf[10] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdsimplepfor_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x646d6973;
  local_48.field_2._M_local_buf[4] = 's';
  local_48.field_2._M_local_buf[5] = 'i';
  local_48.field_2._M_local_buf[6] = 'm';
  local_48.field_2._M_local_buf[7] = 'p';
  local_48.field_2._M_local_buf[8] = 'l';
  local_48.field_2._M_local_buf[9] = 'e';
  local_48.field_2._M_local_buf[10] = 'p';
  local_48.field_2._M_local_buf[0xb] = 'f';
  local_48.field_2._M_local_buf[0xc] = 'o';
  local_48.field_2._M_local_buf[0xd] = 'r';
  local_48._M_string_length = 0xe;
  local_48.field_2._M_local_buf[0xe] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  pfor_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x726f6670;
  local_48._M_string_length = 4;
  local_48.field_2._M_local_buf[4] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdpfor_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x646d6973;
  local_48.field_2._M_local_buf[4] = 'p';
  local_48.field_2._M_local_buf[5] = 'f';
  local_48.field_2._M_local_buf[6] = 'o';
  local_48.field_2._M_local_buf[7] = 'r';
  local_48._M_string_length = 8;
  local_48.field_2._M_local_buf[8] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  pfor2008_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x726f6670;
  local_48.field_2._M_local_buf[4] = '2';
  local_48.field_2._M_local_buf[5] = '0';
  local_48.field_2._M_local_buf[6] = '0';
  local_48.field_2._M_local_buf[7] = '8';
  local_48._M_string_length = 8;
  local_48.field_2._M_local_buf[8] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdnewpfor_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x646d6973;
  local_48.field_2._M_local_buf[4] = 'n';
  local_48.field_2._M_local_buf[5] = 'e';
  local_48.field_2._M_local_buf[6] = 'w';
  local_48.field_2._M_local_buf[7] = 'p';
  local_48.field_2._M_local_buf[8] = 'f';
  local_48.field_2._M_local_buf[9] = 'o';
  local_48.field_2._M_local_buf[10] = 'r';
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  newpfor_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x7077656e;
  local_48.field_2._M_local_buf[4] = 'f';
  local_48.field_2._M_local_buf[5] = 'o';
  local_48.field_2._M_local_buf[6] = 'r';
  local_48._M_string_length = 7;
  local_48.field_2._M_local_buf[7] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  optpfor_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x7074706f;
  local_48.field_2._M_local_buf[4] = 'f';
  local_48.field_2._M_local_buf[5] = 'o';
  local_48.field_2._M_local_buf[6] = 'r';
  local_48._M_string_length = 7;
  local_48.field_2._M_local_buf[7] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  simdoptpfor_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x646d6973;
  local_48.field_2._M_local_buf[4] = 'o';
  local_48.field_2._M_local_buf[5] = 'p';
  local_48.field_2._M_local_buf[6] = 't';
  local_48.field_2._M_local_buf[7] = 'p';
  local_48.field_2._M_local_buf[8] = 'f';
  local_48.field_2._M_local_buf[9] = 'o';
  local_48.field_2._M_local_buf[10] = 'r';
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2540;
  local_48.field_2._M_allocated_capacity._0_4_ = 0x69726176;
  local_48.field_2._M_local_buf[4] = 'n';
  local_48.field_2._M_local_buf[5] = 't';
  local_48._M_string_length = 6;
  local_48.field_2._M_local_buf[6] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  local_48.field_2._M_allocated_capacity._0_4_ = 0x74796276;
  local_48.field_2._M_local_buf[4] = 'e';
  local_48.field_2._M_local_buf[5] = '\0';
  local_48._M_string_length = 5;
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3560;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c35d0;
  local_48.field_2._M_allocated_capacity._0_4_ = 0x6b73616d;
  local_48.field_2._M_local_buf[4] = 'e';
  local_48.field_2._M_local_buf[5] = 'd';
  local_48.field_2._M_local_buf[6] = 'v';
  local_48.field_2._M_local_buf[7] = 'b';
  local_48.field_2._M_local_buf[8] = 'y';
  local_48.field_2._M_local_buf[9] = 't';
  local_48.field_2._M_local_buf[10] = 'e';
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3640;
  local_48.field_2._M_allocated_capacity._0_4_ = 0x65727473;
  local_48.field_2._M_local_buf[4] = 'a';
  local_48.field_2._M_local_buf[5] = 'm';
  local_48.field_2._M_local_buf[6] = 'v';
  local_48.field_2._M_local_buf[7] = 'b';
  local_48.field_2._M_local_buf[8] = 'y';
  local_48.field_2._M_local_buf[9] = 't';
  local_48.field_2._M_local_buf[10] = 'e';
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c36b0;
  local_48.field_2._M_allocated_capacity._0_4_ = 0x69726176;
  local_48.field_2._M_local_buf[4] = 'n';
  local_48.field_2._M_local_buf[5] = 't';
  local_48.field_2._M_local_buf[6] = 'g';
  local_48.field_2._M_local_buf[7] = 'b';
  local_48._M_string_length = 8;
  local_48.field_2._M_local_buf[8] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3720;
  local_48.field_2._M_allocated_capacity._0_4_ = 0x706d6973;
  local_48.field_2._M_local_buf[4] = 'l';
  local_48.field_2._M_local_buf[5] = 'e';
  local_48.field_2._M_local_buf[6] = '1';
  local_48.field_2._M_local_buf[7] = '6';
  local_48._M_string_length = 8;
  local_48.field_2._M_local_buf[8] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  local_48.field_2._M_allocated_capacity._0_4_ = 0x706d6973;
  local_48.field_2._M_local_buf[4] = 'l';
  local_48.field_2._M_local_buf[5] = 'e';
  local_48.field_2._M_local_buf[6] = '9';
  local_48._M_string_length = 7;
  local_48.field_2._M_local_buf[7] = '\0';
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3810;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3900;
  local_48.field_2._M_allocated_capacity._0_4_ = 0x706d6973;
  local_48.field_2._M_local_buf[4] = 'l';
  local_48.field_2._M_local_buf[5] = 'e';
  local_48.field_2._M_local_buf[6] = '9';
  local_48.field_2._M_local_buf[7] = '_';
  local_48.field_2._M_local_buf[8] = 'r';
  local_48.field_2._M_local_buf[9] = 'l';
  local_48.field_2._M_local_buf[10] = 'e';
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  local_48.field_2._M_allocated_capacity._0_4_ = 0x706d6973;
  local_48.field_2._M_local_buf[4] = 'l';
  local_48.field_2._M_local_buf[5] = 'e';
  local_48.field_2._M_local_buf[6] = '8';
  local_48.field_2._M_local_buf[7] = 'b';
  local_48._M_string_length = 8;
  local_48.field_2._M_local_buf[8] = '\0';
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2cb0;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  local_48.field_2._M_allocated_capacity._0_4_ = 0x706d6973;
  local_48.field_2._M_local_buf[4] = 'l';
  local_48.field_2._M_local_buf[5] = 'e';
  local_48.field_2._M_local_buf[6] = '8';
  local_48.field_2._M_local_buf[7] = 'b';
  local_48.field_2._M_local_buf[8] = '_';
  local_48.field_2._M_local_buf[9] = 'r';
  local_48.field_2._M_local_buf[10] = 'l';
  local_48.field_2._M_local_buf[0xb] = 'e';
  local_48._M_string_length = 0xc;
  local_48.field_2._M_local_buf[0xc] = '\0';
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3970;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  varintg8iu_codec();
  local_48.field_2._M_allocated_capacity._0_4_ = 0x69726176;
  local_48.field_2._M_local_buf[4] = 'n';
  local_48.field_2._M_local_buf[5] = 't';
  local_48.field_2._M_local_buf[6] = 'g';
  local_48.field_2._M_local_buf[7] = '8';
  local_48.field_2._M_local_buf[8] = 'i';
  local_48.field_2._M_local_buf[9] = 'u';
  local_48._M_string_length = 10;
  local_48.field_2._M_local_buf[10] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_28._M_head_impl = (IntegerCODEC *)operator_new(0x18);
  (local_28._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3a50;
  local_28._M_head_impl[1]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3ac0;
  local_28._M_head_impl[2]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2540;
  local_50._M_head_impl = (IntegerCODEC *)0x11;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  local_48._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
  local_48.field_2._M_allocated_capacity._0_4_ = SUB84(local_50._M_head_impl,0);
  local_48.field_2._M_local_buf[4] = (char)((ulong)local_50._M_head_impl >> 0x20);
  local_48.field_2._M_local_buf[5] = (char)((ulong)local_50._M_head_impl >> 0x28);
  local_48.field_2._M_local_buf[6] = (char)((ulong)local_50._M_head_impl >> 0x30);
  local_48.field_2._M_local_buf[7] = (char)((ulong)local_50._M_head_impl >> 0x38);
  builtin_strncpy(local_48._M_dataplus._M_p,"simdbinarypacking",0x11);
  local_48._M_string_length = (size_type)local_50._M_head_impl;
  local_48._M_dataplus._M_p[(long)local_50._M_head_impl] = '\0';
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_28._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_28._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(0x18);
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3b30;
  local_50._M_head_impl[1]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3ba0;
  local_50._M_head_impl[2]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2540;
  local_48.field_2._M_allocated_capacity._0_4_ = 0x646d6973;
  local_48.field_2._M_local_buf[4] = 'g';
  local_48.field_2._M_local_buf[5] = 'r';
  local_48.field_2._M_local_buf[6] = 'o';
  local_48.field_2._M_local_buf[7] = 'u';
  local_48.field_2._M_local_buf[8] = 'p';
  local_48.field_2._M_local_buf[9] = 's';
  local_48.field_2._M_local_buf[10] = 'i';
  local_48.field_2._M_local_buf[0xb] = 'm';
  local_48.field_2._M_local_buf[0xc] = 'p';
  local_48.field_2._M_local_buf[0xd] = 'l';
  local_48.field_2._M_local_buf[0xe] = 'e';
  local_48._M_string_length = 0xf;
  local_48.field_2._M_local_buf[0xf] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_28._M_head_impl = (IntegerCODEC *)operator_new(0x18);
  (local_28._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3c10;
  local_28._M_head_impl[1]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3c80;
  local_28._M_head_impl[2]._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c2540;
  local_50._M_head_impl = (IntegerCODEC *)0x17;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  local_48._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
  local_48.field_2._M_allocated_capacity._0_4_ = SUB84(local_50._M_head_impl,0);
  local_48.field_2._M_local_buf[4] = (char)((ulong)local_50._M_head_impl >> 0x20);
  local_48.field_2._M_local_buf[5] = (char)((ulong)local_50._M_head_impl >> 0x28);
  local_48.field_2._M_local_buf[6] = (char)((ulong)local_50._M_head_impl >> 0x30);
  local_48.field_2._M_local_buf[7] = (char)((ulong)local_50._M_head_impl >> 0x38);
  builtin_strncpy(local_48._M_dataplus._M_p,"simdgroupsimple_ringbuf",0x17);
  local_48._M_string_length = (size_type)local_50._M_head_impl;
  local_48._M_dataplus._M_p[(long)local_50._M_head_impl] = '\0';
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_28._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_28._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  local_50._M_head_impl = (IntegerCODEC *)operator_new(8);
  local_48.field_2._M_allocated_capacity._0_4_ = 0x79706f63;
  local_48._M_string_length = 4;
  local_48.field_2._M_local_buf[4] = '\0';
  (local_50._M_head_impl)->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c3cf0;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  p_Var3 = (__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
           ::operator[](&this->scodecmap,&local_48);
  std::__shared_ptr<FastPForLib::IntegerCODEC,(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,(unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
                     *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (IntegerCODEC *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IntegerCODEC[5])();
  }
  return;
}

Assistant:

CODECFactory::CODECFactory() : scodecmap(initializefactory()) {}